

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_invsqrtf.h
# Opt level: O1

float invsqrtf_2(float x)

{
  float fVar1;
  anon_union_4_2_94730110 u;
  
  fVar1 = (float)(0x5f375a86 - ((int)x >> 1));
  fVar1 = (x * -0.5 * fVar1 * fVar1 + 1.5) * fVar1;
  return (x * -0.5 * fVar1 * fVar1 + 1.5) * fVar1;
}

Assistant:

float invsqrtf_2(const float x)
{
    const float xhalf = 0.5 * x;
    union // get bits for floating value
    {
        float x;
        int i;
    } u;
    u.x = x;
    u.i = 0x5F375A86 - (u.i >> 1); // gives initial guess y0. use 0x5fe6ec85e7de30da for double
    u.x = u.x * (1.5F - xhalf * u.x * u.x); // Newton method, repeating increases accuracy
    u.x = u.x * (1.5F - xhalf * u.x * u.x); // Newton method, repeating increases accuracy
    return u.x;
}